

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Initialize(ImGuiContext_conflict1 *context)

{
  ImGuiID IVar1;
  ImGuiViewportP *this;
  ImGuiViewportP_conflict1 **ppIVar2;
  ImGuiViewportP_conflict1 *viewport;
  ImGuiViewportP_conflict1 *local_70;
  ImGuiSettingsHandler_conflict1 local_68;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    local_68.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr_conflict1 *)0x0;
    local_68.UserData = (void *)0x0;
    local_68.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr_conflict1 *)0x0;
    local_68.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_conflict1 *)0x0;
    local_68.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_conflict1 *)0x0;
    local_68.ReadOpenFn =
         (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr_conflict1 *)0x0;
    local_68.TypeHash = 0;
    local_68._12_4_ = 0;
    local_68.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_conflict1 *)0x0;
    local_68.TypeName = "Window";
    IVar1 = ImHashStr("Window",0,0);
    local_68.TypeHash = IVar1;
    local_68.ClearAllFn = WindowSettingsHandler_ClearAll;
    local_68.ReadOpenFn = WindowSettingsHandler_ReadOpen;
    local_68.ReadLineFn = WindowSettingsHandler_ReadLine;
    local_68.ApplyAllFn = WindowSettingsHandler_ApplyAll;
    local_68.WriteAllFn = WindowSettingsHandler_WriteAll;
    ImVector<ImGuiSettingsHandler>::push_back(&context->SettingsHandlers,&local_68);
    TableSettingsInstallHandler((ImGuiContext *)context);
    this = (ImGuiViewportP *)MemAlloc(0x130);
    ImGuiViewportP::ImGuiViewportP(this);
    (this->_ImGuiViewport).ID = 0x11111111;
    (this->_ImGuiViewport).Flags = 4;
    *(undefined4 *)&(this->_ImGuiViewport).field_0x5c = 0;
    *(undefined1 *)((long)&this->LastAlpha + 2) = 1;
    local_68.TypeName = (char *)this;
    ImVector<ImGuiViewportP_*>::push_back
              (&context->Viewports,(ImGuiViewportP_conflict1 **)&local_68);
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&context->Viewports,0);
    local_70 = *ppIVar2;
    ImVector<ImGuiViewport_*>::push_back
              (&(context->PlatformIO).Viewports,(ImGuiViewport **)&local_70);
    DockContextInitialize(context);
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x10e6,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    viewport->Flags = ImGuiViewportFlags_OwnedByApp;
    g.Viewports.push_back(viewport);
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

#ifdef IMGUI_HAS_DOCK
    // Initialize Docking
    DockContextInitialize(&g);
#endif

    g.Initialized = true;
}